

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_extr_s_h_mipsel
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict4 *env)

{
  int64_t acc;
  int64_t temp;
  CPUMIPSState_conflict4 *env_local;
  target_ulong_conflict shift_local;
  target_ulong_conflict ac_local;
  
  acc = CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]) >> ((byte)shift & 0x1f);
  if (acc < 0x8000) {
    if (acc < -0x8000) {
      acc = 0xffff8000;
      set_DSPControl_overflow_flag(1,0x17,env);
    }
  }
  else {
    acc._0_4_ = 0x7fff;
    set_DSPControl_overflow_flag(1,0x17,env);
  }
  return (target_ulong_conflict)acc;
}

Assistant:

target_ulong helper_extr_s_h(target_ulong ac, target_ulong shift,
                             CPUMIPSState *env)
{
    int64_t temp, acc;

    shift = shift & 0x1F;

    acc = ((int64_t)env->active_tc.HI[ac] << 32) |
          ((int64_t)env->active_tc.LO[ac] & 0xFFFFFFFF);

    temp = acc >> shift;

    if (temp > (int64_t)0x7FFF) {
        temp = 0x00007FFF;
        set_DSPControl_overflow_flag(1, 23, env);
    } else if (temp < (int64_t)0xFFFFFFFFFFFF8000ULL) {
        temp = 0xFFFF8000;
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)(int32_t)(temp & 0xFFFFFFFF);
}